

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdf_shake.h
# Opt level: O2

void hash_update_x4_uint16s_le(hash_context_x4 *ctx,uint16_t *data)

{
  uint16_t data3_le;
  uint16_t data2_le;
  uint16_t data1_le;
  uint16_t data0_le;
  
  _data3_le = CONCAT62(CONCAT42(CONCAT22(*data,data[1]),data[2]),data[3]);
  hash_update_x4_4(ctx,(uint8_t *)&data0_le,(uint8_t *)&data1_le,(uint8_t *)&data2_le,
                   (uint8_t *)&data3_le,2);
  return;
}

Assistant:

static inline void hash_update_x4_uint16s_le(hash_context_x4* ctx, const uint16_t data[4]) {
  const uint16_t data0_le = htole16(data[0]);
  const uint16_t data1_le = htole16(data[1]);
  const uint16_t data2_le = htole16(data[2]);
  const uint16_t data3_le = htole16(data[3]);
  hash_update_x4_4(ctx, (const uint8_t*)&data0_le, (const uint8_t*)&data1_le,
                   (const uint8_t*)&data2_le, (const uint8_t*)&data3_le, sizeof(data[0]));
}